

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::Animatable<tinyusdz::value::AssetPath>::Animatable
          (Animatable<tinyusdz::value::AssetPath> *this,AssetPath *v)

{
  AssetPath *v_local;
  Animatable<tinyusdz::value::AssetPath> *this_local;
  
  memset(this,0,0x40);
  tinyusdz::value::AssetPath::AssetPath(&this->_value);
  this->_has_value = false;
  this->_blocked = false;
  TypedTimeSamples<tinyusdz::value::AssetPath>::TypedTimeSamples(&this->_ts);
  set(this,v);
  return;
}

Assistant:

Animatable(const T &v) {
    set(v);
  }